

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset_props.cpp
# Opt level: O0

void __thiscall
icu_63::UnicodeSet::applyPatternIgnoreSpace
          (UnicodeSet *this,UnicodeString *pattern,ParsePosition *pos,SymbolTable *symbols,
          UErrorCode *status)

{
  UBool UVar1;
  undefined1 local_98 [8];
  RuleCharacterIterator chars;
  UnicodeString rebuiltPat;
  UErrorCode *status_local;
  SymbolTable *symbols_local;
  ParsePosition *pos_local;
  UnicodeString *pattern_local;
  UnicodeSet *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    UVar1 = isFrozen(this);
    if (UVar1 == '\0') {
      UnicodeString::UnicodeString((UnicodeString *)&chars.bufPos);
      RuleCharacterIterator::RuleCharacterIterator
                ((RuleCharacterIterator *)local_98,pattern,symbols,pos);
      applyPattern(this,(RuleCharacterIterator *)local_98,symbols,(UnicodeString *)&chars.bufPos,1,0
                   ,0,(UErrorCode *)0x0);
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 == '\0') {
        UVar1 = RuleCharacterIterator::inVariable((RuleCharacterIterator *)local_98);
        if (UVar1 == '\0') {
          setPattern(this,(UnicodeString *)&chars.bufPos);
        }
        else {
          *status = U_MALFORMED_SET;
        }
      }
      UnicodeString::~UnicodeString((UnicodeString *)&chars.bufPos);
    }
    else {
      *status = U_NO_WRITE_PERMISSION;
    }
  }
  return;
}

Assistant:

void
UnicodeSet::applyPatternIgnoreSpace(const UnicodeString& pattern,
                                    ParsePosition& pos,
                                    const SymbolTable* symbols,
                                    UErrorCode& status) {
    if (U_FAILURE(status)) {
        return;
    }
    if (isFrozen()) {
        status = U_NO_WRITE_PERMISSION;
        return;
    }
    // Need to build the pattern in a temporary string because
    // _applyPattern calls add() etc., which set pat to empty.
    UnicodeString rebuiltPat;
    RuleCharacterIterator chars(pattern, symbols, pos);
    applyPattern(chars, symbols, rebuiltPat, USET_IGNORE_SPACE, NULL, 0, status);
    if (U_FAILURE(status)) return;
    if (chars.inVariable()) {
        // syntaxError(chars, "Extra chars in variable value");
        status = U_MALFORMED_SET;
        return;
    }
    setPattern(rebuiltPat);
}